

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_text_set_fixed_value(coda_type_text *type,char *fixed_value)

{
  char *pcVar1;
  char *fixed_value_local;
  coda_type_text *type_local;
  
  if (type == (coda_type_text *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x7c3);
    type_local._4_4_ = -1;
  }
  else if (fixed_value == (char *)0x0) {
    coda_set_error(-100,"fixed_value argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x7c8);
    type_local._4_4_ = -1;
  }
  else if (type->fixed_value == (char *)0x0) {
    pcVar1 = strdup(fixed_value);
    type->fixed_value = pcVar1;
    if (type->fixed_value == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0x7d4);
      type_local._4_4_ = -1;
    }
    else {
      type_local._4_4_ = 0;
    }
  }
  else {
    coda_set_error(-400,"text type already has a fixed value");
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int coda_type_text_set_fixed_value(coda_type_text *type, const char *fixed_value)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (fixed_value == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "fixed_value argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->fixed_value != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "text type already has a fixed value");
        return -1;
    }
    type->fixed_value = strdup(fixed_value);
    if (type->fixed_value == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }

    return 0;
}